

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip_config.c
# Opt level: O1

void get_qual_hostname(char *buf,int len,attr_list attrs,int *network_p,CMTransport_trace trace_func
                      ,void *trace_data)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  void *pvVar5;
  hostent *phVar6;
  size_t sVar7;
  char *pcVar8;
  int *piVar9;
  undefined4 in_register_00000034;
  in_addr *in;
  uint *__cp;
  long lVar10;
  undefined8 uVar11;
  addrinfo *paVar12;
  char **ppcVar13;
  char *network_string;
  addrinfo *info;
  char hostname [1024];
  char *local_488;
  undefined8 local_480;
  addrinfo *local_478;
  char *local_470;
  addrinfo local_468;
  uint local_438;
  undefined4 uStack_434;
  undefined1 local_39;
  
  local_488 = getenv("ADIOS2_NETWORK");
  pcVar3 = getenv("ADIOS2_HOSTNAME");
  if (pcVar3 != (char *)0x0) {
    strncpy(buf,pcVar3,0xff);
    return;
  }
  local_480 = CONCAT44(in_register_00000034,len);
  gethostname(buf,0xff);
  buf[0xfe] = '\0';
  sVar4 = strlen(buf);
  pvVar5 = memchr(buf,0x2e,sVar4);
  if (pvVar5 == (void *)0x0) {
    lVar10 = sVar4 << 0x20;
    buf[(int)sVar4] = '.';
    iVar1 = getdomainname(buf + (int)sVar4 + 1,0xfe00000000 - lVar10 >> 0x20);
    if (iVar1 == -1) {
      buf[lVar10 + 0x100000000 >> 0x20] = '\0';
    }
    if (buf[lVar10 + 0x100000000 >> 0x20] == '\0') {
      phVar6 = gethostbyname(buf);
      buf[(int)sVar4] = '\0';
      if (phVar6 != (hostent *)0x0) {
        strncpy(buf,phVar6->h_name,0xff);
      }
    }
    buf[0xfe] = '\0';
  }
  (*(code *)attrs)(network_p,"CM<IP_CONFIG> - Tentative Qualified hostname %s",buf);
  sVar4 = strlen(buf);
  pvVar5 = memchr(buf,0x2e,sVar4);
  uVar11 = local_480;
  if (pvVar5 == (void *)0x0) {
    local_39 = 0;
    gethostname((char *)&local_438,0x3ff);
    local_468.ai_addrlen = 0;
    local_468._20_4_ = 0;
    local_468.ai_addr = (sockaddr *)0x0;
    local_468.ai_canonname = (char *)0x0;
    local_468.ai_next = (addrinfo *)0x0;
    local_468.ai_socktype = 1;
    local_468.ai_protocol = 0;
    local_468.ai_flags = 2;
    local_468.ai_family = 0;
    iVar1 = getaddrinfo((char *)&local_438,(char *)0x0,&local_468,&local_478);
    paVar12 = local_478;
    if (iVar1 != 0) {
      get_qual_hostname_cold_1();
      paVar12 = local_478;
    }
    for (; paVar12 != (addrinfo *)0x0; paVar12 = paVar12->ai_next) {
      strcpy(buf,paVar12->ai_canonname);
    }
    freeaddrinfo(local_478);
  }
  if (*buf == '\0') {
LAB_001046a4:
    phVar6 = (hostent *)0x0;
  }
  else {
    phVar6 = gethostbyname(buf);
    if (phVar6 == (hostent *)0x0) {
      *buf = '\0';
      goto LAB_001046a4;
    }
  }
  if (phVar6 != (hostent *)0x0) {
    ppcVar13 = phVar6->h_addr_list;
    __cp = (uint *)*ppcVar13;
    if (__cp != (uint *)0x0) {
      iVar1 = 0;
      local_470 = buf;
      do {
        ppcVar13 = ppcVar13 + 1;
        if ((char)*__cp != '\x7f') {
          iVar1 = iVar1 + 1;
          inet_ntop(2,__cp,(char *)&local_438,0x10);
          uVar2 = *__cp;
          (*(code *)attrs)(network_p,"CM<IP_CONFIG> - Hostname gets good addr %lx, %s",
                           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                           uVar2 << 0x18,&local_438);
        }
        __cp = (uint *)*ppcVar13;
      } while (__cp != (uint *)0x0);
      buf = local_470;
      uVar11 = local_480;
      if (iVar1 != 0) goto LAB_00104722;
    }
    *buf = '\0';
  }
LAB_00104722:
  if (*buf == '\0') {
    iVar1 = get_string_attr(uVar11,CM_IP_INTERFACE,&local_438);
    if (iVar1 == 0) {
      pcVar3 = (char *)0x0;
    }
    else {
      pcVar3 = (char *)CONCAT44(uStack_434,local_438);
    }
    uVar2 = get_self_ip_iface((CMTransport_trace)attrs,network_p,pcVar3);
    uVar2 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    local_468.ai_flags = uVar2;
    (*(code *)attrs)(network_p,"CM<IP_CONFIG> - No hostname yet, trying gethostbyaddr on IP %lx",
                     uVar2);
    uVar2 = (local_468.ai_flags & 0xff00U) << 8 | local_468.ai_flags << 0x18;
    if (((uVar2 != 0xb6100000) && (uVar2 != 0xc0a80000)) &&
       (local_468.ai_flags << 0x18 != 0xa000000)) {
      phVar6 = gethostbyaddr(&local_468,4,2);
      if (phVar6 == (hostent *)0x0) {
        piVar9 = __h_errno_location();
        (*(code *)attrs)(network_p,"     FAILED, errno %d",*piVar9);
      }
      else {
        (*(code *)attrs)(network_p,"     result was %s",phVar6->h_name);
        strncpy(buf,phVar6->h_name,0xff);
      }
    }
  }
  if (local_488 == (char *)0x0) {
    if (get_qual_hostname::CM_NETWORK_POSTFIX == -1) {
      get_qual_hostname::CM_NETWORK_POSTFIX = attr_atom_from_string("ADIOS2_NETWORK_POSTFIX");
    }
    iVar1 = get_string_attr(uVar11,get_qual_hostname::CM_NETWORK_POSTFIX,&local_488);
    if (iVar1 == 0) {
      (*(code *)attrs)(network_p,"TCP/IP transport found no NETWORK POSTFIX attribute");
    }
    else {
      (*(code *)attrs)(network_p,"TCP/IP transport found NETWORK POSTFIX attribute %s",local_488);
    }
  }
  pcVar3 = local_488;
  if (local_488 != (char *)0x0) {
    sVar4 = strlen(buf);
    sVar7 = strlen(pcVar3);
    sVar4 = sVar4 + sVar7 + 2;
    pcVar3 = (char *)malloc(sVar4);
    pcVar8 = strchr(buf,0x2e);
    memset(pcVar3,0,sVar4);
    *pcVar8 = '\0';
    sprintf(pcVar3,"%s%s.%s",buf,local_488,pcVar8 + 1);
    phVar6 = gethostbyname(pcVar3);
    if (phVar6 != (hostent *)0x0) {
      strcpy(buf,pcVar3);
    }
    free(pcVar3);
  }
  if ((*buf != '\0') && (phVar6 = gethostbyname(buf), phVar6 != (hostent *)0x0)) {
    sVar4 = strlen(buf);
    pvVar5 = memchr(buf,0x2e,sVar4);
    if (pvVar5 != (void *)0x0) goto LAB_001048f9;
  }
  iVar1 = get_self_ip_iface((CMTransport_trace)attrs,network_p,(char *)0x0);
  if (iVar1 == 0) {
    if (get_qual_hostname_warn_once == '\0') {
      get_qual_hostname_warn_once = '\x01';
      (*(code *)attrs)(network_p,
                       "Attempts to establish your fully qualified hostname, or indeed any\nuseful network name, have failed horribly.  using localhost.\n"
                      );
    }
    strncpy(buf,"localhost",0xff);
  }
  else {
    uVar2 = get_self_ip_iface((CMTransport_trace)attrs,network_p,(char *)0x0);
    local_438 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    pcVar3 = inet_ntop(2,&local_438,buf,0xff);
    if (pcVar3 == (char *)0x0) {
      (*(code *)attrs)(network_p,"inet_ntop failed\n");
    }
  }
LAB_001048f9:
  (*(code *)attrs)(network_p,"CM<IP_CONFIG> - GetQualHostname returning %s",buf);
  return;
}

Assistant:

static void
get_qual_hostname(char *buf, int len, attr_list attrs,
		  int *network_p, CMTransport_trace trace_func, void *trace_data)
{
    struct hostent *host = NULL;

    char *network_string = getenv(IPCONFIG_ENVVAR_PREFIX "NETWORK");
    char *hostname_string = getenv(IPCONFIG_ENVVAR_PREFIX "HOSTNAME");
    if (hostname_string != NULL) {
	strncpy(buf, hostname_string, len);
	return;
    }
    (void)get_qual_hostname;
    gethostname(buf, len);
    buf[len - 1] = '\0';
    if (memchr(buf, '.', strlen(buf)) == NULL) {
	/* no dots, probably not fully qualified */
#ifdef HAVE_GETDOMAINNAME
	int end = strlen(buf);
	buf[end] = '.';
	if (getdomainname((&buf[end]) + 1, len - end - 1) == -1) {
	    buf[end+1]=0;
	}
	if (buf[end + 1] == 0) {
	    char *tmp_name;
	    struct hostent *host = gethostbyname(buf);
	    buf[end] = 0;
	    /* getdomainname was useless, hope that gethostbyname helps */
	    if (host) {
		tmp_name = host->h_name;
		strncpy(buf, tmp_name, len);
	    }		
	}
#else
	{
	    /* no getdomainname, hope that gethostbyname will help */
	    struct hostent *he = gethostbyname(buf);
	    char *tmp_name;
	    if (he) {
		tmp_name = (gethostbyname(buf))->h_name;
		strncpy(buf, tmp_name, len);
	    }
	}
#endif
	buf[len - 1] = '\0';
    }
    trace_func(trace_data, "CM<IP_CONFIG> - Tentative Qualified hostname %s", buf);
    if (memchr(buf, '.', strlen(buf)) == NULL) {
	/* useless hostname if it's not fully qualified */
	struct addrinfo hints, *info, *p;
	int gai_result;

	char hostname[1024];
	hostname[1023] = '\0';
	gethostname(hostname, 1023);

	memset(&hints, 0, sizeof hints);
	hints.ai_family = AF_UNSPEC; /*either IPV4 or IPV6*/
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_flags = AI_CANONNAME;

	if ((gai_result = getaddrinfo(hostname, NULL, &hints, &info)) != 0) {
	    fprintf(stderr, "getaddrinfo: %s\n", gai_strerror(gai_result));
	}

	for(p = info; p != NULL; p = p->ai_next) {
	    strcpy(buf, p->ai_canonname);
	}

	freeaddrinfo(info);
    }
    if ((buf[0] != 0) && ((host = gethostbyname(buf)) == NULL)) {
	/* useless hostname if we can't translate it */
	buf[0] = 0;
    }
    if (host != NULL) {
	char **p;
	int good_addr = 0;
	for (p = host->h_addr_list; *p != 0; p++) {
	    struct in_addr *in = *(struct in_addr **) p;
	    if (!ipv4_is_loopback(ntohl(in->s_addr))) {
	        char str[INET_ADDRSTRLEN];
		good_addr++;
					      
		inet_ntop(AF_INET, &(in->s_addr), str, sizeof(str));
		trace_func(trace_data, "CM<IP_CONFIG> - Hostname gets good addr %lx, %s",
			   ntohl(in->s_addr), str);
	    }
	}
	if (good_addr == 0) {
	    /* 
	     * even a fully qualifiedhostname that doesn't get us a valid
	     * IP addr is useless
	     */
	    buf[0] = 0;
	}
    }
    if (buf[0] == 0) {
	/* bloody hell, what do you have to do? */
	struct in_addr IP;
	extern int h_errno;
	char *iface;
	if (get_string_attr(attrs, CM_IP_INTERFACE, &iface)){
	    IP.s_addr = htonl(get_self_ip_iface(trace_func, trace_data, iface));
	} else {
	    IP.s_addr = htonl(get_self_ip_addr(trace_func, trace_data));
	}
	trace_func(trace_data, "CM<IP_CONFIG> - No hostname yet, trying gethostbyaddr on IP %lx", IP);
	if (!is_private_IP(ntohl(IP.s_addr))) {
	    host = gethostbyaddr((char *) &IP, sizeof(IP), AF_INET);
	    if (host != NULL) {
		trace_func(trace_data, "     result was %s", host->h_name);
		strncpy(buf, host->h_name, len);
	    } else {
		trace_func(trace_data, "     FAILED, errno %d", h_errno);
	    }
	}
    }
    if (network_string == NULL) {
	static atom_t CM_NETWORK_POSTFIX = -1;
	if (CM_NETWORK_POSTFIX == -1) {
	    CM_NETWORK_POSTFIX = attr_atom_from_string(IPCONFIG_ENVVAR_PREFIX "NETWORK_POSTFIX");
	}
	if (!get_string_attr(attrs, CM_NETWORK_POSTFIX, &network_string)) {
	    trace_func(trace_data, "TCP/IP transport found no NETWORK POSTFIX attribute");
	} else {
	    trace_func(trace_data, "TCP/IP transport found NETWORK POSTFIX attribute %s", network_string);
	}
    }
    if (network_string != NULL) {
	size_t name_len = strlen(buf) + 2 + strlen(network_string);
	char *new_name_str = malloc(name_len);
	char *first_dot = strchr(buf, '.');

	/* stick the CM_NETWORK value in there */
	memset(new_name_str, 0, name_len);
	*first_dot = 0;
	first_dot++;
	sprintf(new_name_str, "%s%s.%s", buf, network_string, first_dot);
	if (gethostbyname(new_name_str) != NULL) {
	    /* host has no NETWORK interface */
	    strcpy(buf, new_name_str);
	    if (network_p) (*network_p)++;
	}
	free(new_name_str);
    }

    if ((buf[0] == 0) ||
	((host = gethostbyname(buf)) == NULL) ||
	(memchr(buf, '.', strlen(buf)) == NULL)) {
	/* just use the bloody IP address */
	struct in_addr IP;
	IP.s_addr = htonl(get_self_ip_addr(trace_func, trace_data));
	if (IP.s_addr != 0) {
	    struct in_addr ip;
	    ip.s_addr = htonl(get_self_ip_addr(trace_func, trace_data));
	    if (!inet_ntop(AF_INET, &(ip.s_addr), buf, len)) {
	        trace_func(trace_data, "inet_ntop failed\n");
	    }
	} else {
	    static int warn_once = 0;
	    if (warn_once == 0) {
		warn_once++;
		trace_func(trace_data, "Attempts to establish your fully qualified hostname, or indeed any\nuseful network name, have failed horribly.  using localhost.\n");
	    }
	    strncpy(buf, "localhost", len);
	}
    }
    trace_func(trace_data, "CM<IP_CONFIG> - GetQualHostname returning %s", buf);
}